

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O1

ZyanStatus
ZydisFormatterIntelPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  ulong uVar3;
  void *pvVar4;
  ZyanStatus ZVar5;
  ZydisShortString *source;
  ulong uVar6;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x138,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x139,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x13a,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  source = ZydisRegisterGetStringWrapped(reg);
  if (source == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar5 = ZydisStringAppendShortCase(&buffer->string,&STR_INVALID_REG,formatter->case_registers)
      ;
      if ((int)ZVar5 < 0) {
        return ZVar5;
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      uVar3 = buffer->capacity;
      ZVar5 = 0x80100009;
      if (ZVar2 + 10 < uVar3) {
        pvVar4 = (buffer->string).vector.data;
        *(char *)((long)pvVar4 + -1) = (char)ZVar2;
        *(undefined8 *)((long)pvVar4 + ZVar2) = 0x696c61766e690007;
        *(undefined2 *)((long)pvVar4 + ZVar2 + 8) = 100;
        uVar6 = buffer->capacity - (ZVar2 + 2);
        buffer->capacity = uVar6;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
        (buffer->string).vector.size = 8;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        (buffer->string).vector.capacity = uVar6;
        ZVar5 = 0x100000;
      }
      if (uVar3 <= ZVar2 + 10) {
        return ZVar5;
      }
    }
    ZVar5 = 0x100000;
  }
  else if ((buffer->is_token_list == '\0') ||
          (ZVar5 = ZydisFormatterBufferAppend(buffer,'\a'), -1 < (int)ZVar5)) {
    ZVar5 = ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
    return ZVar5;
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_REG, formatter->case_registers);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_REGISTER);
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}